

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinedH264Demuxer.cpp
# Opt level: O1

void __thiscall CombinedH264Demuxer::openFile(CombinedH264Demuxer *this,string *streamName)

{
  int iVar1;
  undefined4 *puVar2;
  ostringstream ss;
  uint *local_1b0;
  undefined8 local_1a8;
  uint local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  ostringstream local_190 [376];
  
  iVar1 = (*this->m_bufferedReader->_vptr_AbstractReader[8])
                    (this->m_bufferedReader,(ulong)(uint)this->m_readerID,
                     (streamName->_M_dataplus)._M_p,0,0);
  if ((char)iVar1 != '\0') {
    this->m_dataProcessed = 0;
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Can\'t open stream ",0x12);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,(streamName->_M_dataplus)._M_p,streamName->_M_string_length);
  puVar2 = (undefined4 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar2 = 100;
  *(undefined4 **)(puVar2 + 2) = puVar2 + 6;
  if (local_1b0 == &local_1a0) {
    puVar2[6] = local_1a0;
    puVar2[7] = uStack_19c;
    puVar2[8] = uStack_198;
    puVar2[9] = uStack_194;
  }
  else {
    *(uint **)(puVar2 + 2) = local_1b0;
    *(ulong *)(puVar2 + 6) = CONCAT44(uStack_19c,local_1a0);
  }
  *(undefined8 *)(puVar2 + 4) = local_1a8;
  local_1a0 = local_1a0 & 0xffffff00;
  __cxa_throw(puVar2,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

void CombinedH264Demuxer::openFile(const std::string& streamName)
{
    readClose();

    if (!m_bufferedReader->openStream(m_readerID, streamName.c_str()))
        THROW(ERR_FILE_NOT_FOUND, "Can't open stream " << streamName)

    m_dataProcessed = 0;
}